

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::GetConfigsBoundsCase::iterate(GetConfigsBoundsCase *this)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  EGLint numConfigAll_00;
  int numConfigRequested;
  int iVar2;
  bool bVar3;
  EGLint numConfigAll;
  Random rnd;
  undefined1 local_1b0 [384];
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  (this->super_CallLogWrapper).m_enableLog = true;
  eglu::CallLogWrapper::eglGetConfigs
            (&this->super_CallLogWrapper,this->m_display,(EGLConfig *)0x0,0,&numConfigAll);
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::ostream::operator<<(this_00,numConfigAll);
  std::operator<<((ostream *)this_00," configs available");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  local_1b0._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  if (numConfigAll < 1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "No configs");
  }
  else {
    deRandom_init(&rnd.m_rnd,0x7b);
    iVar2 = 5;
    while( true ) {
      numConfigAll_00 = numConfigAll;
      bVar3 = iVar2 == 0;
      iVar2 = iVar2 + -1;
      if (bVar3) break;
      numConfigRequested = de::Random::getInt((Random *)&rnd.m_rnd,0,numConfigAll);
      checkGetConfigsBounds(this,(Random *)&rnd.m_rnd,numConfigAll_00,numConfigRequested);
      local_1b0._0_8_ = pTVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    }
    checkGetConfigsBounds(this,&rnd,numConfigAll,-1);
  }
  (this->super_CallLogWrapper).m_enableLog = false;
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		tcu::TestLog&	log		= m_testCtx.getLog();
		EGLint			numConfigAll;

		enableLogging(true);

		eglGetConfigs(m_display, 0, 0, &numConfigAll);

		log << TestLog::Message << numConfigAll << " configs available" << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;

		if (numConfigAll > 0)
		{
			de::Random		rnd					(123);

			for (int i = 0; i < 5; i++)
			{
				checkGetConfigsBounds(rnd, numConfigAll, rnd.getInt(0, numConfigAll));
				log << TestLog::Message << TestLog::EndMessage;
			}

			checkGetConfigsBounds(rnd, numConfigAll, -1);
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "No configs");
		}

		enableLogging(false);

		return STOP;
	}